

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_1::InvalidShareContextCase::iterate(InvalidShareContextCase *this)

{
  EGLConfig *config;
  EGLDisplay *display;
  ostringstream *poVar1;
  TestLog *pTVar2;
  int iVar3;
  int iVar4;
  Library *pLVar5;
  undefined4 extraout_var;
  char *description;
  EGLint attribListB [9];
  RenderingContext contextA;
  EGLint attribListA [9];
  EGLint local_258 [12];
  RenderingContext local_228;
  Enum<int,_2UL> local_1f8;
  Enum<int,_2UL> local_1e8;
  EGLint local_1d8 [10];
  undefined1 local_1b0 [384];
  
  pTVar2 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  pLVar5 = EglTestContext::getLibrary((this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "EGL_BAD_MATCH is generated if reset notification strategies do not match when creating shared contexts\n\n"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1d8[4] = 0x30bf;
  local_1d8[5] = 1;
  local_1d8[6] = 0x3138;
  local_1d8[7] = 0x31be;
  local_1d8[0] = 0x3098;
  local_1d8[1] = 3;
  local_1d8[2] = 0x30fb;
  local_1d8[3] = 1;
  local_1d8[8] = 0x3038;
  local_258[4] = 0x30bf;
  local_258[5] = 1;
  local_258[6] = 0x3138;
  local_258[7] = 0x31bf;
  local_258[0] = 0x3098;
  local_258[1] = 3;
  local_258[2] = 0x30fb;
  local_258[3] = 1;
  local_258[8] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,local_1d8);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Create context A (share_context = EGL_NO_CONTEXT)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  config = &(this->super_RobustnessTestCase).m_eglConfig;
  display = &(this->super_RobustnessTestCase).m_eglDisplay;
  local_1b0._0_8_ = (TestLog *)0x0;
  RenderingContext::RenderingContext
            (&local_228,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1d8,
             config,display,(EGLContext *)local_1b0);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Create context B (share_context = context A)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  logAttribList((this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_258);
  iVar3 = (*pLVar5->_vptr_Library[6])(pLVar5,*display,*config,local_228.m_context,local_258);
  iVar4 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
  if (iVar4 != 0x3009) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Test failed! eglCreateContext() returned with error [");
    local_1e8.m_getName = eglu::getErrorName;
    local_1e8.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", expected ");
    local_1f8.m_getName = eglu::getErrorName;
    local_1f8.m_value = 0x3009;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  if (CONCAT44(extraout_var,iVar3) != 0) {
    (*pLVar5->_vptr_Library[0x13])(pLVar5,*display,CONCAT44(extraout_var,iVar3));
  }
  description = "Pass";
  if (iVar4 != 0x3009) {
    description = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,(uint)(iVar4 != 0x3009),description);
  RenderingContext::~RenderingContext(&local_228);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate	(void)
	{
		TestLog&		log		=	m_testCtx.getLog();
		const Library&	egl		=	m_eglTestCtx.getLibrary();
		bool			isOk	=	true;

		log << tcu::TestLog::Message
			<< "EGL_BAD_MATCH is generated if reset notification strategies do not match when creating shared contexts\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribListA[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_NO_RESET_NOTIFICATION,
			EGL_NONE
		};

		const EGLint attribListB[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribListA);

		log << tcu::TestLog::Message << "Create context A (share_context = EGL_NO_CONTEXT)" << tcu::TestLog::EndMessage;
		RenderingContext contextA(m_eglTestCtx, attribListA, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);

		log << tcu::TestLog::Message << "Create context B (share_context = context A)" << tcu::TestLog::EndMessage;
		logAttribList(m_eglTestCtx, attribListB);

		EGLContext contextB = egl.createContext(m_eglDisplay, m_eglConfig, contextA.getContext(), attribListB);

		const EGLenum error = egl.getError();
		if (error != EGL_BAD_MATCH)
		{
			log << TestLog::Message
				<< "Test failed! eglCreateContext() returned with error [" << eglu::getErrorStr(error) << ", expected " << eglu::getErrorStr(EGL_BAD_MATCH) << "]"
				<< TestLog::EndMessage;

			isOk = false;
		}

		if (contextB != EGL_NO_CONTEXT)
			egl.destroyContext(m_eglDisplay, contextB);

		if (isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}